

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_Utility.cpp
# Opt level: O1

void amrex::UtilCreateDirectoryDestructive(string *path,bool callbarrier)

{
  ostringstream *this;
  bool bVar1;
  int iVar2;
  undefined1 local_1a0 [24];
  undefined8 auStack_188 [46];
  
  if (*(int *)(DAT_00756620 + -0x3c) == *(int *)(DAT_00756620 + -0x30)) {
    bVar1 = FileSystem::Exists(path);
    if (bVar1) {
      iVar2 = Verbose();
      if (1 < iVar2) {
        local_1a0._8_8_ = OutStream();
        this = (ostringstream *)(local_1a0 + 0x10);
        local_1a0._4_4_ = *(MPI_Comm *)(DAT_00756620 + -0x48);
        local_1a0._0_4_ = *(int *)(DAT_00756620 + -0x30);
        std::__cxx11::ostringstream::ostringstream(this);
        *(undefined8 *)((long)auStack_188 + *(long *)(local_1a0._16_8_ - 0x18)) =
             *(undefined8 *)(local_1a0._8_8_ + *(long *)(*(long *)local_1a0._8_8_ + -0x18) + 8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)this,"amrex::UtilCreateCleanDirectoryDestructive():  ",0x2f);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)this,(path->_M_dataplus)._M_p,path->_M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)this," exists.  I am destroying it.  ",0x1f);
        std::ios::widen((char)*(undefined8 *)(local_1a0._16_8_ - 0x18) + (char)this);
        std::ostream::put((char)this);
        std::ostream::flush();
        Print::~Print((Print *)local_1a0);
      }
      FileSystem::RemoveAll(path);
    }
    bVar1 = FileSystem::CreateDirectories(path,0x1ed,false);
    if (!bVar1) {
      CreateDirectoryFailed(path);
    }
  }
  if (callbarrier) {
    local_1a0._0_8_ = local_1a0 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1a0,"amrex::UtilCreateCleanDirectoryDestructive","");
    ParallelDescriptor::Barrier((string *)local_1a0);
    if ((undefined1 *)local_1a0._0_8_ != local_1a0 + 0x10) {
      operator_delete((void *)local_1a0._0_8_,local_1a0._16_8_ + 1);
    }
  }
  return;
}

Assistant:

void
amrex::UtilCreateDirectoryDestructive(const std::string &path, bool callbarrier)
{
  if(ParallelContext::IOProcessorSub())
  {
    if(amrex::FileExists(path))
    {
      if (amrex::Verbose() > 1) {
          amrex::Print() << "amrex::UtilCreateCleanDirectoryDestructive():  " << path
                         << " exists.  I am destroying it.  " << std::endl;
      }
      FileSystem::RemoveAll(path);
    }
    if( ! amrex::UtilCreateDirectory(path, 0755))
    {
      amrex::CreateDirectoryFailed(path);
    }
  }
  if(callbarrier)
  {
    // Force other processors to wait until directory is built.
    ParallelDescriptor::Barrier("amrex::UtilCreateCleanDirectoryDestructive");
  }
}